

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc_utils.cc
# Opt level: O3

bool sptk::ComputeLowerAndUpperBounds
               (double confidence_level,int num_data,vector<double,_std::allocator<double>_> *mean,
               vector<double,_std::allocator<double>_> *variance,
               vector<double,_std::allocator<double>_> *lower_bound,
               vector<double,_std::allocator<double>_> *upper_bound)

{
  pointer pdVar1;
  pointer pdVar2;
  pointer pdVar3;
  double dVar4;
  bool bVar5;
  ulong uVar6;
  int degrees_of_freedom;
  long lVar7;
  uint uVar8;
  undefined4 in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  double dVar9;
  double t;
  double local_50;
  undefined1 local_48 [16];
  
  if (0 < num_data && (0.0 < confidence_level && confidence_level < 100.0)) {
    if (upper_bound == (vector<double,_std::allocator<double>_> *)0x0) {
      return false;
    }
    if (lower_bound == (vector<double,_std::allocator<double>_> *)0x0) {
      return false;
    }
    lVar7 = (long)(mean->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(mean->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_start;
    if (lVar7 != (long)(variance->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)(variance->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data._M_start) {
      return false;
    }
    local_48._8_4_ = in_XMM0_Dc;
    local_48._0_8_ = confidence_level;
    local_48._12_4_ = in_XMM0_Dd;
    if ((long)(lower_bound->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(lower_bound->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start != lVar7) {
      std::vector<double,_std::allocator<double>_>::resize(lower_bound,lVar7 >> 3);
      lVar7 = (long)(mean->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(mean->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                    super__Vector_impl_data._M_start;
      confidence_level = (double)local_48._0_8_;
    }
    if ((long)(upper_bound->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(upper_bound->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start != lVar7) {
      std::vector<double,_std::allocator<double>_>::resize(upper_bound,lVar7 >> 3);
      confidence_level = (double)local_48._0_8_;
    }
    degrees_of_freedom = num_data + -1;
    if (degrees_of_freedom != 0) {
      bVar5 = ComputePercentagePointOfTDistribution
                        ((confidence_level / -100.0 + 1.0) * 0.5,degrees_of_freedom,&local_50);
      if (!bVar5) {
        return bVar5;
      }
      uVar8 = (uint)((ulong)((long)(mean->super__Vector_base<double,_std::allocator<double>_>).
                                   _M_impl.super__Vector_impl_data._M_finish -
                            (long)(mean->super__Vector_base<double,_std::allocator<double>_>).
                                  _M_impl.super__Vector_impl_data._M_start) >> 3);
      if ((int)uVar8 < 1) {
        return bVar5;
      }
      dVar9 = 1.0 / (double)degrees_of_freedom;
      pdVar1 = (lower_bound->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pdVar2 = (upper_bound->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      uVar6 = 0;
      local_48._0_8_ = dVar9;
      do {
        dVar4 = (variance->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start[uVar6] * dVar9;
        if (dVar4 < 0.0) {
          dVar4 = sqrt(dVar4);
          dVar9 = (double)local_48._0_8_;
        }
        else {
          dVar4 = SQRT(dVar4);
        }
        pdVar3 = (mean->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar1[uVar6] = pdVar3[uVar6] - local_50 * dVar4;
        pdVar2[uVar6] = dVar4 * local_50 + pdVar3[uVar6];
        uVar6 = uVar6 + 1;
      } while ((uVar8 & 0x7fffffff) != uVar6);
      return bVar5;
    }
  }
  return false;
}

Assistant:

bool ComputeLowerAndUpperBounds(double confidence_level, int num_data,
                                const std::vector<double>& mean,
                                const std::vector<double>& variance,
                                std::vector<double>* lower_bound,
                                std::vector<double>* upper_bound) {
  if (confidence_level <= 0.0 || 100.0 <= confidence_level || num_data <= 0 ||
      mean.size() != variance.size() || NULL == lower_bound ||
      NULL == upper_bound) {
    return false;
  }

  if (lower_bound->size() != mean.size()) {
    lower_bound->resize(mean.size());
  }
  if (upper_bound->size() != mean.size()) {
    upper_bound->resize(mean.size());
  }

  const int degrees_of_freedom(num_data - 1);
  if (0 == degrees_of_freedom) {
    return false;
  }

  double t;
  if (!sptk::ComputePercentagePointOfTDistribution(
          0.5 * (1.0 - confidence_level / 100.0), degrees_of_freedom, &t)) {
    return false;
  }

  const double inverse_degrees_of_freedom(1.0 / degrees_of_freedom);
  const int vector_length(static_cast<int>(mean.size()));
  double* l(&((*lower_bound)[0]));
  double* u(&((*upper_bound)[0]));
  for (int i(0); i < vector_length; ++i) {
    const double error(std::sqrt(variance[i] * inverse_degrees_of_freedom));
    l[i] = mean[i] - t * error;
    u[i] = mean[i] + t * error;
  }

  return true;
}